

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O1

void __thiscall
libtorrent::upnp::on_upnp_get_ip_address_response
          (upnp *this,error_code *e,http_parser *p,rootdevice *d,http_connection *c)

{
  http_connection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar1;
  _Manager_type __cp;
  int iVar2;
  int iVar3;
  in_addr_t iVar4;
  char *pcVar5;
  int *piVar6;
  unsigned_long uVar7;
  anon_enum_32 aVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_00;
  double dVar10;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  string_view input;
  span<const_char> sVar12;
  bytes_type bytes;
  ip_address_parse_state s;
  shared_ptr<libtorrent::upnp> me;
  undefined8 local_b8;
  undefined8 uStack_b0;
  _Any_data local_a0;
  _Manager_type local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  unsigned_long local_70;
  undefined8 *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  __shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::upnp,void>
            (local_38,(__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
  this_00 = (d->upnp_connection).
            super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar9 = extraout_XMM0_Da;
  uVar11 = extraout_XMM0_Db;
  if (this_00 == c) {
    aux::http_connection::close(this_00,0);
    uVar9 = 0;
    uVar11 = 0;
    this_01 = (d->upnp_connection).
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (d->upnp_connection).
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (d->upnp_connection).
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      uVar9 = extraout_XMM0_Da_00;
      uVar11 = extraout_XMM0_Db_00;
    }
  }
  if (this->m_closing != false) goto LAB_00393082;
  dVar10 = (double)CONCAT44(uVar11,uVar9);
  if (e->failed_ == true) {
    dVar10 = (double)CONCAT44(uVar11,uVar9);
    if ((DAT_004fcee8 != 0x8fafd21e25c5e09b) &&
       (dVar10 = (double)CONCAT44(uVar11,uVar9), DAT_004fcee8 != 0xb2ab117a257edf0d)) {
      dVar10 = (double)(**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                                 (&boost::asio::error::get_misc_category()::instance,2);
    }
    if (e->val_ == 2) {
      bVar1 = e->cat_->id_ != DAT_004fcee8;
      if (DAT_004fcee8 == 0) {
        bVar1 = e->cat_ != (error_category *)&boost::asio::error::get_misc_category()::instance;
      }
      if (!bVar1) goto LAB_00392eb0;
    }
    iVar2 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar2 != '\0') {
      (*e->cat_->_vptr_error_category[4])(&local_a0,e->cat_,(ulong)(uint)e->val_);
      log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((_Manager_type *)local_a0._M_unused._0_8_ != &local_90) {
        operator_delete(local_a0._M_unused._M_object,(ulong)(local_90 + 1));
      }
    }
  }
  else {
LAB_00392eb0:
    if (p->m_state == read_body) {
      if (p->m_status_code == 200) {
        sVar12 = aux::http_parser::get_body(p);
        pcVar5 = sVar12.m_ptr;
        iVar2 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
        if ((char)iVar2 != '\0') {
          local_a0._M_unused._M_object = &local_90;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,pcVar5,pcVar5 + (long)sVar12.m_len);
          log(this,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          if ((_Manager_type *)local_a0._M_unused._0_8_ != &local_90) {
            operator_delete(local_a0._M_unused._M_object,(ulong)(local_90 + 1));
          }
        }
        local_a0._0_4_ = (uint)local_a0._M_unused._M_member_pointer & 0xffff0000;
        local_a0._4_4_ = 0xffffffff;
        local_a0._M_pod_data[8] = '\0';
        local_88 = 0;
        local_80 = (_func_bool__Any_data_ptr__Any_data_ptr__Manager_operation)0x0;
        local_68 = (undefined8 *)0x0;
        uStack_60 = 0;
        local_58 = (code *)0x0;
        pcStack_50 = (code *)0x0;
        local_90 = (_Manager_type)&local_80;
        local_68 = (undefined8 *)operator_new(0x10);
        *local_68 = find_ip_address;
        local_68[1] = &local_a0;
        pcStack_50 = ::std::
                     _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::ip_address_parse_state>))(int,_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::ip_address_parse_state_&)>_>
                     ::_M_invoke;
        local_58 = ::std::
                   _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::ip_address_parse_state>))(int,_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::ip_address_parse_state_&)>_>
                   ::_M_manager;
        input._M_str = (char *)&local_68;
        input._M_len = (size_t)pcVar5;
        aux::xml_parse((aux *)sVar12.m_len,input,
                       (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_a0);
        dVar10 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
        if (local_58 != (code *)0x0) {
          dVar10 = (double)(*local_58)(&local_68,&local_68,3);
        }
        if (local_a0._4_4_ != -1) {
          dVar10 = log(this,dVar10);
        }
        if (local_88 == 0) {
          log(this,dVar10);
        }
        else {
          log(this,dVar10);
          __cp = local_90;
          local_70 = 0;
          iVar2 = boost::asio::detail::socket_ops::inet_pton(10,(char *)local_90,&local_b8);
          if (iVar2 < 1) {
            local_48 = 0;
            uStack_40 = 0;
            uVar7 = 0;
          }
          else {
            local_48 = local_b8;
            uStack_40 = uStack_b0;
            uVar7 = local_70;
          }
          if (ignore_error[4] == '\0') {
            local_b8 = local_48;
            uStack_b0 = uStack_40;
            aVar8 = ipv6;
            iVar4 = 0;
          }
          else {
            piVar6 = __errno_location();
            *piVar6 = 0;
            iVar3 = inet_pton(2,(char *)__cp,&local_b8);
            iVar2 = *piVar6;
            ignore_error[4] = iVar2 != 0;
            ignore_error._0_4_ = iVar2;
            if (iVar3 < 1 && iVar2 == 0) {
              ignore_error._0_8_ = 0x100000016;
            }
            ignore_error._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
            if (ignore_error[4] == '\0') {
              iVar4 = (in_addr_t)local_b8;
              if (iVar3 < 1) {
                iVar4 = 0;
              }
            }
            else {
              iVar4 = 0;
            }
            uStack_b0 = 0;
            local_b8 = 0;
            uVar7 = 0;
            aVar8 = ipv4;
          }
          (d->external_ip).super_address.type_ = aVar8;
          (d->external_ip).super_address.ipv4_address_.addr_.s_addr = iVar4;
          *(undefined8 *)&(d->external_ip).super_address.ipv6_address_.addr_.__in6_u = local_b8;
          *(undefined8 *)((long)&(d->external_ip).super_address.ipv6_address_.addr_.__in6_u + 8) =
               uStack_b0;
          (d->external_ip).super_address.ipv6_address_.scope_id_ = uVar7;
        }
        if (0 < (int)((ulong)((long)(this->m_mappings).
                                    super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                    .
                                    super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_mappings).
                                   super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                   .
                                   super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
          update_map(this,d,(port_mapping_t)0x0);
        }
        if (local_90 != (_Manager_type)&local_80) {
          operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
        }
        goto LAB_00393082;
      }
      iVar2 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
      if ((char)iVar2 != '\0') {
        log(this,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      }
    }
    else {
      log(this,dVar10);
    }
  }
  if (0 < (int)((ulong)((long)(this->m_mappings).
                              super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                              .
                              super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_mappings).
                             super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                             .
                             super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
    update_map(this,d,(port_mapping_t)0x0);
  }
LAB_00393082:
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

void upnp::on_upnp_get_ip_address_response(error_code const& e
	, aux::http_parser const& p, rootdevice& d
	, http_connection& c)
{
	TORRENT_ASSERT(is_single_thread());
	std::shared_ptr<upnp> me(self());

	TORRENT_ASSERT(d.magic == 1337);
	if (d.upnp_connection && d.upnp_connection.get() == &c)
	{
		d.upnp_connection->close();
		d.upnp_connection.reset();
	}

	if (m_closing) return;

	if (e && e != boost::asio::error::eof)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while getting external IP address: %s"
				, e.message().c_str());
		}
#endif
		if (num_mappings() > 0) update_map(d, port_mapping_t{0});
		return;
	}

	if (!p.header_finished())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("error while getting external IP address: incomplete http message");
#endif
		if (num_mappings() > 0) update_map(d, port_mapping_t{0});
		return;
	}

	if (p.status_code() != 200)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while getting external IP address: %s"
				, p.message().c_str());
		}
#endif
		if (num_mappings() > 0) update_map(d, port_mapping_t{0});
		return;
	}

	// response may look like
	// <?xml version="1.0"?>
	// <s:Envelope xmlns:s="http://schemas.xmlsoap.org/soap/envelope/" s:encodingStyle="http://schemas.xmlsoap.org/soap/encoding/">
	// <s:Body><u:GetExternalIPAddressResponse xmlns:u="urn:schemas-upnp-org:service:WANIPConnection:1">
	// <NewExternalIPAddress>192.168.160.19</NewExternalIPAddress>
	// </u:GetExternalIPAddressResponse>
	// </s:Body>
	// </s:Envelope>

	span<char const> body = p.get_body();
#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("get external IP address response: %s"
			, std::string(body.data(), static_cast<std::size_t>(body.size())).c_str());
	}
#endif

	ip_address_parse_state s;
	xml_parse({body.data(), std::size_t(body.size())}, std::bind(&find_ip_address, _1, _2, std::ref(s)));
#ifndef TORRENT_DISABLE_LOGGING
	if (s.error_code != -1)
	{
		log("error while getting external IP address, code: %d", s.error_code);
	}
#endif

	if (!s.ip_address.empty())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("got router external IP address %s", s.ip_address.c_str());
#endif
		d.external_ip = make_address(s.ip_address.c_str(), ignore_error);
	}
	else
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("failed to find external IP address in response");
#endif
	}

	if (num_mappings() > 0) update_map(d, port_mapping_t{0});
}